

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SMBusAnalyzer.cpp
# Opt level: O2

AnalyzerChannelData * __thiscall SMBusAnalyzer::GetNearestTransitionChannel(SMBusAnalyzer *this)

{
  AnalyzerChannelData **ppAVar1;
  char cVar2;
  ulong uVar3;
  ulong uVar4;
  AnalyzerChannelData **ppAVar5;
  AnalyzerChannelData **ppAVar6;
  
  ppAVar1 = &this->mSMBDAT;
  ppAVar5 = &this->mSMBCLK;
  do {
    cVar2 = AnalyzerChannelData::DoMoreTransitionsExistInCurrentData();
    if (cVar2 != '\0') break;
    cVar2 = AnalyzerChannelData::DoMoreTransitionsExistInCurrentData();
  } while (cVar2 == '\0');
  cVar2 = AnalyzerChannelData::DoMoreTransitionsExistInCurrentData();
  if (cVar2 == '\0') {
    AnalyzerChannelData::GetSampleOfNextEdge();
    cVar2 = AnalyzerChannelData::WouldAdvancingToAbsPositionCauseTransition((ulonglong)*ppAVar1);
    ppAVar6 = ppAVar5;
    if (cVar2 == '\0') goto LAB_0010b32b;
  }
  cVar2 = AnalyzerChannelData::DoMoreTransitionsExistInCurrentData();
  if (cVar2 == '\0') {
    AnalyzerChannelData::GetSampleOfNextEdge();
    cVar2 = AnalyzerChannelData::WouldAdvancingToAbsPositionCauseTransition((ulonglong)*ppAVar5);
    ppAVar6 = ppAVar1;
    if (cVar2 == '\0') goto LAB_0010b32b;
  }
  uVar3 = AnalyzerChannelData::GetSampleOfNextEdge();
  uVar4 = AnalyzerChannelData::GetSampleOfNextEdge();
  ppAVar6 = ppAVar5;
  if (uVar3 < uVar4) {
    ppAVar6 = ppAVar1;
  }
LAB_0010b32b:
  return *ppAVar6;
}

Assistant:

AnalyzerChannelData* SMBusAnalyzer::GetNearestTransitionChannel()
{
    // if neither channel has more transitions, block for more data.
    while( !mSMBDAT->DoMoreTransitionsExistInCurrentData() && !mSMBCLK->DoMoreTransitionsExistInCurrentData() )
    {
        // DoMoreTransitionsExistInCurrentData will block for up to 250ms waiting for more data, and it will trigger a thread exit if the
        // capture ends and there is still no more data.
    }

    if( !mSMBDAT->DoMoreTransitionsExistInCurrentData() )
    {
        auto next_clk_edge = mSMBCLK->GetSampleOfNextEdge();
        if( !mSMBDAT->WouldAdvancingToAbsPositionCauseTransition( next_clk_edge ) )
        {
            return mSMBCLK;
        }
    }

    if( !mSMBCLK->DoMoreTransitionsExistInCurrentData() )
    {
        auto next_dat_edge = mSMBDAT->GetSampleOfNextEdge();
        if( !mSMBCLK->WouldAdvancingToAbsPositionCauseTransition( next_dat_edge ) )
        {
            return mSMBDAT;
        }
    }

    if( mSMBDAT->GetSampleOfNextEdge() < mSMBCLK->GetSampleOfNextEdge() )
        return mSMBDAT;

    return mSMBCLK;
}